

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&,_const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&,_const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>
  *in_RDX;
  strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>
  *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
  ::
  convert<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>>
            (&local_40,
             (StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
  ::
  convert<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>>
            (&local_60,
             (StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
              *)this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }